

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O0

void cali::write_report_for_query(cali_id_t chn_id,char *query,int flush_opts,ostream *os)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar1;
  ostream *poVar2;
  void *this_00;
  ChannelBody *chB;
  anon_class_8_1_6897f1c6 local_698;
  SnapshotFlushFn local_690;
  SnapshotView local_670;
  undefined1 local_660 [8];
  QueryProcessor queryP;
  OutputStream stream;
  QuerySpec spec;
  Log local_488;
  CalQLParser local_280;
  CalQLParser parser;
  Log local_270;
  undefined1 local_58 [8];
  Channel channel;
  Caliper c;
  ostream *os_local;
  int flush_opts_local;
  char *query_local;
  cali_id_t chn_id_local;
  
  this = &channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  Caliper::Caliper((Caliper *)this);
  Caliper::get_channel((Caliper *)local_58,(cali_id_t)this);
  bVar1 = Channel::operator_cast_to_bool((Channel *)local_58);
  if (bVar1) {
    CalQLParser::CalQLParser(&local_280,query);
    bVar1 = CalQLParser::error(&local_280);
    if (bVar1) {
      Log::Log(&local_488,0);
      poVar2 = Log::stream(&local_488);
      poVar2 = std::operator<<(poVar2,"write_report_for_query(): query parse error: ");
      CalQLParser::error_msg_abi_cxx11_
                ((string *)
                 &spec.preprocess_ops.
                  super__Vector_base<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_280);
      poVar2 = std::operator<<(poVar2,(string *)
                                      &spec.preprocess_ops.
                                       super__Vector_base<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string
                ((string *)
                 &spec.preprocess_ops.
                  super__Vector_base<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Log::~Log(&local_488);
    }
    else {
      CalQLParser::spec((QuerySpec *)
                        &stream.mP.
                         super___shared_ptr<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount,&local_280);
      OutputStream::OutputStream
                ((OutputStream *)
                 &queryP.mP.
                  super___shared_ptr<cali::QueryProcessor::QueryProcessorImpl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      OutputStream::set_stream
                ((OutputStream *)
                 &queryP.mP.
                  super___shared_ptr<cali::QueryProcessor::QueryProcessorImpl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,os);
      QueryProcessor::QueryProcessor
                ((QueryProcessor *)local_660,
                 (QuerySpec *)
                 &stream.mP.
                  super___shared_ptr<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 (OutputStream *)
                 &queryP.mP.
                  super___shared_ptr<cali::QueryProcessor::QueryProcessorImpl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      chB = Channel::body((Channel *)local_58);
      SnapshotView::SnapshotView(&local_670);
      local_698.queryP = (QueryProcessor *)local_660;
      std::
      function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
      ::
      function<cali::write_report_for_query(unsigned_long,char_const*,int,std::ostream&)::__0,void>
                ((function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
                  *)&local_690,&local_698);
      Caliper::flush((Caliper *)
                     &channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,chB,local_670,&local_690);
      std::
      function<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&)>
      ::~function(&local_690);
      QueryProcessor::flush
                ((QueryProcessor *)local_660,
                 (CaliperMetadataAccessInterface *)
                 &channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      QueryProcessor::~QueryProcessor((QueryProcessor *)local_660);
      OutputStream::~OutputStream
                ((OutputStream *)
                 &queryP.mP.
                  super___shared_ptr<cali::QueryProcessor::QueryProcessorImpl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      QuerySpec::~QuerySpec
                ((QuerySpec *)
                 &stream.mP.
                  super___shared_ptr<cali::OutputStream::OutputStreamImpl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    parser.mP._M_t.
    super___uniq_ptr_impl<cali::CalQLParser::CalQLParserImpl,_std::default_delete<cali::CalQLParser::CalQLParserImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_cali::CalQLParser::CalQLParserImpl_*,_std::default_delete<cali::CalQLParser::CalQLParserImpl>_>
    .super__Head_base<0UL,_cali::CalQLParser::CalQLParserImpl_*,_false>._M_head_impl._5_3_ = 0;
    parser.mP._M_t.
    super___uniq_ptr_impl<cali::CalQLParser::CalQLParserImpl,_std::default_delete<cali::CalQLParser::CalQLParserImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_cali::CalQLParser::CalQLParserImpl_*,_std::default_delete<cali::CalQLParser::CalQLParserImpl>_>
    .super__Head_base<0UL,_cali::CalQLParser::CalQLParserImpl_*,_false>._M_head_impl._4_1_ = bVar1;
    CalQLParser::~CalQLParser(&local_280);
  }
  else {
    Log::Log(&local_270,0);
    poVar2 = Log::stream(&local_270);
    poVar2 = std::operator<<(poVar2,"write_report_for_query(): invalid channel id ");
    this_00 = (void *)std::ostream::operator<<(poVar2,chn_id);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    Log::~Log(&local_270);
    parser.mP._M_t.
    super___uniq_ptr_impl<cali::CalQLParser::CalQLParserImpl,_std::default_delete<cali::CalQLParser::CalQLParserImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_cali::CalQLParser::CalQLParserImpl_*,_std::default_delete<cali::CalQLParser::CalQLParserImpl>_>
    .super__Head_base<0UL,_cali::CalQLParser::CalQLParserImpl_*,_false>._M_head_impl._4_4_ = 1;
  }
  Channel::~Channel((Channel *)local_58);
  Caliper::~Caliper((Caliper *)
                    &channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
  return;
}

Assistant:

void write_report_for_query(cali_id_t chn_id, const char* query, int flush_opts, std::ostream& os)
{
    Caliper c;
    Channel channel = c.get_channel(chn_id);

    if (!channel) {
        Log(0).stream() << "write_report_for_query(): invalid channel id " << chn_id << std::endl;

        return;
    }

    CalQLParser parser(query);

    if (parser.error()) {
        Log(0).stream() << "write_report_for_query(): query parse error: " << parser.error_msg() << std::endl;

        return;
    }

    QuerySpec    spec(parser.spec());
    OutputStream stream;

    stream.set_stream(&os);

    QueryProcessor queryP(spec, stream);

    c.flush(channel.body(), SnapshotView(), [&queryP](CaliperMetadataAccessInterface& db, const std::vector<Entry>& rec) {
        queryP.process_record(db, rec);
    });

    queryP.flush(c);
}